

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

char * ImParseFormatFindEnd(char *fmt)

{
  char *pcVar1;
  char cVar2;
  
  if ((*fmt == '%') && (cVar2 = *fmt, cVar2 != '\0')) {
    pcVar1 = fmt + 1;
    do {
      fmt = pcVar1;
      if (((byte)(cVar2 + 0xbfU) < 0x1a) && ((0x900U >> ((byte)(cVar2 - 1) & 0x1f) & 1) == 0)) {
        return fmt;
      }
      if (((byte)(cVar2 + 0x9fU) < 0x1a) && ((0x2480a80U >> ((byte)(cVar2 - 1) & 0x1f) & 1) == 0)) {
        return fmt;
      }
      cVar2 = *fmt;
      pcVar1 = fmt + 1;
    } while (cVar2 != '\0');
  }
  return fmt;
}

Assistant:

const char* ImParseFormatFindEnd(const char* fmt)
{
    // Printf/scanf types modifiers: I/L/h/j/l/t/w/z. Other uppercase letters qualify as types aka end of the format.
    if (fmt[0] != '%')
        return fmt;
    const unsigned int ignored_uppercase_mask = (1 << ('I'-'A')) | (1 << ('L'-'A'));
    const unsigned int ignored_lowercase_mask = (1 << ('h'-'a')) | (1 << ('j'-'a')) | (1 << ('l'-'a')) | (1 << ('t'-'a')) | (1 << ('w'-'a')) | (1 << ('z'-'a'));
    for (char c; (c = *fmt) != 0; fmt++)
    {
        if (c >= 'A' && c <= 'Z' && ((1 << (c - 'A')) & ignored_uppercase_mask) == 0)
            return fmt + 1;
        if (c >= 'a' && c <= 'z' && ((1 << (c - 'a')) & ignored_lowercase_mask) == 0)
            return fmt + 1;
    }
    return fmt;
}